

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void virtual_do_end(dill_stream s,int package)

{
  basic_block *bb;
  ssize_t *psVar1;
  undefined8 *puVar2;
  double dVar3;
  char cVar4;
  byte bVar5;
  special_operations sVar6;
  virtual_insn *insns;
  vreg_info *pvVar7;
  special_op p_Var8;
  vreg_info *pvVar9;
  arith_op2 p_Var10;
  dill_stream pdVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  char *pcVar19;
  basic_block_conflict pbVar20;
  bit_vec pbVar21;
  ulong uVar22;
  long lVar23;
  basic_block_conflict pbVar24;
  long lVar25;
  ulong uVar26;
  void *pvVar27;
  bit_vec pbVar28;
  private_ctx pdVar29;
  short *__s;
  int *piVar30;
  ulong uVar31;
  jmp_data *pjVar32;
  jmp_table pjVar33;
  dill_exec_handle handle;
  ushort uVar34;
  uint uVar35;
  int iVar36;
  int vreg;
  int extraout_EDX;
  int extraout_EDX_00;
  int vreg_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int vreg_01;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int vreg_02;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int vreg_03;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int vreg_04;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int vreg_05;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int vreg_06;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int vreg_07;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int vreg_08;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int vreg_09;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int vreg_10;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int vreg_11;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int vreg_12;
  int extraout_EDX_27;
  int extraout_EDX_28;
  char *pcVar37;
  virtual_insn *extraout_RDX;
  virtual_insn *extraout_RDX_00;
  virtual_insn *extraout_RDX_01;
  virtual_insn *extraout_RDX_02;
  virtual_insn *extraout_RDX_03;
  virtual_insn *extraout_RDX_04;
  virtual_insn *extraout_RDX_05;
  virtual_insn *extraout_RDX_06;
  virtual_insn *extraout_RDX_07;
  virtual_insn *extraout_RDX_08;
  virtual_insn *extraout_RDX_09;
  virtual_insn *extraout_RDX_10;
  virtual_insn *extraout_RDX_11;
  virtual_insn *extraout_RDX_12;
  virtual_insn *extraout_RDX_13;
  virtual_insn *extraout_RDX_14;
  virtual_insn *extraout_RDX_15;
  virtual_insn *extraout_RDX_16;
  virtual_insn *extraout_RDX_17;
  virtual_insn *extraout_RDX_18;
  virtual_insn *extraout_RDX_19;
  virtual_insn *extraout_RDX_20;
  virtual_insn *extraout_RDX_21;
  virtual_insn *extraout_RDX_22;
  virtual_insn *extraout_RDX_23;
  virtual_insn *extraout_RDX_24;
  virtual_insn *pvVar38;
  virtual_insn *extraout_RDX_25;
  virtual_insn *pvVar39;
  virtual_insn *extraout_RDX_26;
  virtual_insn *extraout_RDX_27;
  virtual_insn *extraout_RDX_28;
  virtual_insn *extraout_RDX_29;
  virtual_insn *extraout_RDX_30;
  virtual_insn *extraout_RDX_31;
  virtual_insn *pvVar40;
  label_translation_table plVar41;
  uint uVar42;
  uint uVar43;
  code *info_ptr;
  label_translation_table plVar44;
  int iVar45;
  label_translation_table plVar46;
  int *piVar47;
  dill_reg *pdVar48;
  arith_op3 *pp_Var49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  long lVar53;
  virtual_mach_info pmVar54;
  bool bVar55;
  int local_120;
  int dtmpa;
  int local_f8;
  int local_f4;
  ulong local_f0;
  label_translation_table local_e8;
  virtual_mach_info local_e0;
  uint local_d4;
  char *local_d0;
  char *local_c8;
  int *local_c0;
  int local_b4;
  int itmpa;
  basic_block *local_a8;
  preg_info *local_a0;
  preg_info *local_98;
  undefined8 local_90;
  uint local_88;
  vreg_info *local_80;
  int itmpb;
  int local_6c;
  ssize_t local_68;
  char *local_60;
  char *local_58;
  ssize_t local_50;
  ulong local_48;
  long local_40;
  dill_reg local_34;
  
  pdVar29 = s->p;
  pmVar54 = (virtual_mach_info)pdVar29->mach_info;
  insns = (virtual_insn *)pdVar29->code_base;
  pvVar38 = (virtual_insn *)pdVar29->cur_ip;
  iVar36 = pmVar54->prefix_code_start;
  iVar17 = s->dill_local_pointer;
  local_b4 = package;
  if (virtual_do_end::dill_verbose == -1) {
    pcVar19 = getenv("DILL_VERBOSE");
    virtual_do_end::dill_verbose = (int)(pcVar19 != (char *)0x0);
    pcVar19 = getenv("DILL_NOOPTIMIZE");
    virtual_do_end::no_optimize = (int)(pcVar19 != (char *)0x0);
    pcVar19 = getenv("DILL_OLD_REGS");
    virtual_do_end::old_reg_alloc = (int)(pcVar19 != (char *)0x0);
    pcVar19 = getenv("DILL_DO_EMULATION");
    virtual_do_end::do_emulation = (int)(pcVar19 != (char *)0x0);
  }
  pvVar40 = insns + iVar36;
  if (iVar36 == -1) {
    pvVar40 = pvVar38;
  }
  (pdVar29->virtual).code_base = (char *)insns;
  pmVar54->bbcount = 0;
  pbVar20 = (basic_block_conflict)dill_malloc(0x68);
  pmVar54->bblist = pbVar20;
  pbVar20->start = 0;
  pbVar20->label = -1;
  local_e0 = pmVar54;
  pbVar21 = new_bit_vec(s->p->vreg_count);
  pbVar20->regs_used = pbVar21;
  pbVar21 = new_bit_vec(s->p->vreg_count);
  pbVar20->regs_defined = pbVar21;
  pbVar20->reg_assigns = (short *)0x0;
  pbVar20->end_branch_label = -1;
  pbVar20->fall_through = 0;
  pbVar20->is_loop_start = 0;
  pbVar20->is_loop_end = 0;
  if (pvVar40 < pvVar38) {
    uVar22 = (ulong)((long)pvVar40 - (long)insns) / 0x28;
    pbVar20->start = uVar22;
    for (pvVar39 = insns + uVar22; pmVar54 = local_e0, pvVar39 < pvVar38; pvVar39 = pvVar39 + 1) {
      uVar22 = uVar22 + 1;
      build_bb_body(s,pvVar39,(int)uVar22,insns);
    }
    pbVar20 = local_e0->bblist;
    iVar36 = local_e0->bbcount;
    lVar23 = (long)iVar36;
    pbVar20[lVar23].end_branch_label = -1;
    pbVar20[lVar23].fall_through = 1;
    pbVar20[lVar23].end = uVar22 - 1;
    local_e0->bbcount = iVar36 + 1;
    pbVar24 = (basic_block_conflict)dill_realloc(pbVar20,lVar23 * 0x68 + 0xd0);
    pmVar54->bblist = pbVar24;
    iVar36 = pmVar54->bbcount;
    pbVar24[iVar36].start = uVar22;
    psVar1 = &pbVar24[iVar36].end;
    *(undefined4 *)psVar1 = 0xffffffff;
    *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
    *(int *)(psVar1 + 1) = -1;
    *(int *)((long)psVar1 + 0xc) = -1;
    pbVar24[iVar36].fall_through = 0;
    pbVar24[iVar36].is_loop_start = 0;
    pbVar24[iVar36].is_loop_end = 0;
    pbVar20 = pbVar24 + iVar36;
    pbVar21 = new_bit_vec(s->p->vreg_count);
    pbVar24[iVar36].regs_used = pbVar21;
    pbVar21 = new_bit_vec(s->p->vreg_count);
    pbVar24[iVar36].regs_defined = pbVar21;
  }
  pbVar20->start = 0;
  lVar23 = 1;
  for (pvVar38 = insns; pmVar54 = local_e0, pvVar38 < pvVar40; pvVar38 = pvVar38 + 1) {
    build_bb_body(s,pvVar38,(int)lVar23,insns);
    lVar23 = lVar23 + 1;
  }
  pbVar20 = local_e0->bblist;
  iVar36 = local_e0->bbcount;
  lVar25 = (long)iVar36;
  pbVar20[lVar25].end_branch_label = -1;
  pbVar20[lVar25].fall_through = 0;
  pbVar20[lVar25].end = lVar23 + -1;
  local_e0->bbcount = iVar36 + 1;
  pbVar20 = (basic_block_conflict)dill_realloc(pbVar20,lVar25 * 0x68 + 0xd0);
  pmVar54->bblist = pbVar20;
  lVar25 = (long)pmVar54->bbcount;
  pbVar20[lVar25].start = lVar23;
  psVar1 = &pbVar20[lVar25].end;
  *(undefined4 *)psVar1 = 0xffffffff;
  *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
  *(int *)(psVar1 + 1) = -1;
  *(int *)((long)psVar1 + 0xc) = -1;
  pbVar20[lVar25].fall_through = 0;
  pbVar20[lVar25].is_loop_start = 0;
  pbVar20[lVar25].is_loop_end = 0;
  pbVar21 = new_bit_vec(s->p->vreg_count);
  pbVar20[lVar25].regs_used = pbVar21;
  pbVar21 = new_bit_vec(s->p->vreg_count);
  pbVar20[lVar25].regs_defined = pbVar21;
  free(pbVar20[lVar25].regs_used);
  free(pbVar20[lVar25].regs_defined);
  pbVar20[lVar25 + -1].end = pbVar20[lVar25 + -1].end + -1;
  lVar23 = 0x1c;
  for (uVar22 = 0; uVar26 = (ulong)pmVar54->bbcount, uVar22 < uVar26; uVar22 = uVar22 + 1) {
    pbVar20 = pmVar54->bblist;
    *(undefined4 *)((long)&pbVar20->end + lVar23 + 4) = 0;
    *(undefined4 *)((long)&pbVar20->start + lVar23) = 0;
    pvVar27 = dill_malloc(8);
    *(void **)((long)&pbVar20->end_branch_label + lVar23) = pvVar27;
    pvVar27 = dill_malloc(4);
    *(void **)((long)&pbVar20->start + lVar23 + 4) = pvVar27;
    *(undefined8 *)((long)&pbVar20->succ_list + lVar23 + 4) = 0;
    lVar23 = lVar23 + 0x68;
  }
  for (uVar22 = 0; uVar22 < (ulong)(long)(int)uVar26; uVar22 = uVar22 + 1) {
    pbVar20 = pmVar54->bblist;
    iVar36 = (int)uVar22;
    if (pbVar20[uVar22].fall_through != 0) {
      pbVar20[uVar22].succ_list[pbVar20[uVar22].succ_count] = iVar36 + 1;
      pbVar20[uVar22].succ_count = pbVar20[uVar22].succ_count + 1;
      add_pred(pbVar20 + uVar22 + 1,iVar36);
      uVar26 = (ulong)(uint)pmVar54->bbcount;
    }
    if (pbVar20[uVar22].end_branch_label != -1) {
      for (uVar35 = 0; (int)uVar35 < (int)uVar26; uVar35 = uVar35 + 1) {
        pbVar24 = pmVar54->bblist;
        if (pbVar24[(int)uVar35].label == pbVar20[uVar22].end_branch_label) {
          pbVar20[uVar22].succ_list[pbVar20[uVar22].succ_count] = uVar35;
          pbVar20[uVar22].succ_count = pbVar20[uVar22].succ_count + 1;
          add_pred(pbVar24 + (int)uVar35,iVar36);
          uVar35 = pmVar54->bbcount;
          uVar26 = (ulong)uVar35;
        }
      }
    }
  }
  pvVar27 = s->p->mach_info;
  pbVar21 = new_bit_vec(s->p->vreg_count);
  lVar23 = 0x48;
  for (lVar25 = 0; uVar22 = (ulong)*(int *)((long)pvVar27 + 8), lVar25 < (long)uVar22;
      lVar25 = lVar25 + 1) {
    lVar52 = *(long *)((long)pvVar27 + 0x10);
    pbVar28 = new_bit_vec(s->p->vreg_count);
    *(bit_vec *)(lVar52 + lVar23) = pbVar28;
    lVar23 = lVar23 + 0x68;
  }
  for (lVar23 = 0; lVar23 < (int)uVar22; lVar23 = lVar23 + 1) {
    lVar52 = lVar23 * 0x68 + *(long *)((long)pvVar27 + 0x10);
    for (lVar25 = 0; lVar25 < *(int *)(lVar52 + 0x1c); lVar25 = lVar25 + 1) {
      add_regs(*(bit_vec *)
                (*(long *)((long)pvVar27 + 0x10) + 0x48 +
                (long)*(int *)(*(long *)(lVar52 + 0x20) + lVar25 * 4) * 0x68),
               *(bit_vec *)(lVar52 + 0x38));
    }
    uVar22 = (ulong)*(uint *)((long)pvVar27 + 8);
  }
  uVar35 = 1;
  pmVar54 = local_e0;
  while (uVar35 != 0) {
    uVar35 = 0;
    for (lVar23 = 0; lVar23 < (int)uVar22; lVar23 = lVar23 + 1) {
      lVar25 = *(long *)((long)pvVar27 + 0x10);
      lVar53 = lVar23 * 0x68;
      memset(pbVar21->vec,0,(long)pbVar21->len);
      add_regs(pbVar21,*(bit_vec *)(lVar25 + 0x48 + lVar53));
      pmVar54 = local_e0;
      lVar52 = *(long *)(lVar25 + 0x40 + lVar53);
      uVar34 = pbVar21->len;
      if ((short)uVar34 < 1) {
        uVar34 = 0;
      }
      for (uVar22 = 0; uVar34 != uVar22; uVar22 = uVar22 + 1) {
        pbVar21->vec[uVar22] = pbVar21->vec[uVar22] & ~*(byte *)(lVar52 + 2 + uVar22);
      }
      for (lVar52 = 0; lVar52 < *(int *)(lVar25 + lVar53 + 0x1c); lVar52 = lVar52 + 1) {
        uVar12 = add_regs(*(bit_vec *)
                           (*(long *)((long)pvVar27 + 0x10) + 0x48 +
                           (long)*(int *)(*(long *)(lVar25 + lVar53 + 0x20) + lVar52 * 4) * 0x68),
                          pbVar21);
        uVar35 = uVar35 | uVar12;
      }
      uVar22 = (ulong)*(uint *)((long)pvVar27 + 8);
    }
  }
  free(pbVar21);
  if (virtual_do_end::no_optimize == 0) {
    if (count_verbose == -1) {
      pcVar19 = getenv("DILL_COUNTS");
      count_verbose = (int)(pcVar19 != (char *)0x0);
    }
    if (count_verbose == 1) {
      uVar35 = virtual_insn_count(s);
      printf("Prior to optimization, %d non-null virtual insns\n",(ulong)uVar35);
    }
    apply_to_each(s,insns,pmVar54,do_const_prop);
    if (count_verbose == 1) {
      uVar35 = virtual_insn_count(s);
      printf("After constant propagation, %d non-null virtual insns\n",(ulong)uVar35);
    }
    apply_to_each(s,insns,pmVar54,do_com_sub_exp);
    if (count_verbose == 1) {
      uVar35 = virtual_insn_count(s);
      printf("After duplicate instruction elimination (CSE-lite), %d non-null virtual insns\n",
             (ulong)uVar35);
    }
    pdVar29 = s->p;
    uVar26 = 0;
    uVar22 = (ulong)(uint)pdVar29->vreg_count;
    if (pdVar29->vreg_count < 1) {
      uVar22 = uVar26;
    }
    for (; uVar22 * 0x2c - uVar26 != 0; uVar26 = uVar26 + 0x2c) {
      *(undefined4 *)((long)&(pdVar29->vregs->use_info).use_count + uVar26) = 0;
    }
    uVar26 = 0;
    uVar22 = (ulong)(uint)pdVar29->c_param_count;
    if (pdVar29->c_param_count < 1) {
      uVar22 = uVar26;
    }
    for (; uVar22 * 0x14 - uVar26 != 0; uVar26 = uVar26 + 0x14) {
      *(undefined4 *)((long)&pdVar29->c_param_args->used + uVar26) = 0;
    }
    apply_to_each(s,insns,pmVar54,do_use_def_count);
    apply_to_each(s,insns,pmVar54,kill_dead);
    pdVar29 = s->p;
    uVar35 = pdVar29->c_param_count;
    while ((0 < (int)uVar35 && (pdVar29->c_param_args[(ulong)uVar35 - 1].used == 0))) {
      uVar35 = uVar35 - 1;
      pdVar29->c_param_count = uVar35;
    }
  }
  else {
    pdVar29 = s->p;
  }
  if (virtual_do_end::dill_verbose != 0) {
    pvVar27 = pdVar29->mach_info;
    lVar25 = 0;
    for (lVar23 = 0; lVar23 < *(int *)((long)pvVar27 + 8); lVar23 = lVar23 + 1) {
      dump_bb(s,(basic_block *)(*(long *)((long)pvVar27 + 0x10) + lVar25),(int)lVar23);
      lVar25 = lVar25 + 0x68;
    }
    s->dill_debug = 1;
    pdVar29 = s->p;
    pmVar54 = local_e0;
  }
  (pdVar29->virtual).mach_jump = s->j;
  (pdVar29->virtual).mach_reset = pdVar29->mach_reset;
  (pdVar29->virtual).mach_info = pdVar29->mach_info;
  pvVar38 = (virtual_insn *)pdVar29->code_base;
  pvVar40 = (virtual_insn *)pdVar29->cur_ip;
  (pdVar29->virtual).code_base = (char *)pvVar38;
  (pdVar29->virtual).cur_ip = (char *)pvVar40;
  (pdVar29->virtual).code_limit = pdVar29->code_limit;
  if (virtual_do_end::do_emulation == 0) {
    if (dill_foreign_cg != (dill_foreign_cg_func)0x0) {
      (*dill_foreign_cg)(s,pvVar38,pvVar40);
      goto LAB_0010d2dc;
    }
    s->j = (pdVar29->native).mach_jump;
    pvVar27 = (pdVar29->native).mach_info;
    pdVar29->mach_reset = (pdVar29->native).mach_reset;
    pdVar29->mach_info = pvVar27;
    pcVar19 = (pdVar29->native).code_base;
    pdVar29->code_base = pcVar19;
    (pdVar29->native).mach_info = (void *)0x0;
    (pdVar29->native).code_base = (char *)0x0;
    if (pcVar19 == (char *)0x0) {
      init_code_block(s);
      pdVar29 = s->p;
      pcVar19 = pdVar29->code_base;
      pcVar37 = pdVar29->code_limit;
      (pdVar29->native).code_base = pcVar19;
      (pdVar29->native).code_limit = pcVar37;
    }
    else {
      pcVar37 = (pdVar29->native).code_limit;
    }
    pdVar29->cur_ip = pcVar19;
    pdVar29->code_limit = pcVar37;
    (*pdVar29->native_mach_reset)(s);
    uVar35 = (s->p->branch_table).next_label;
    lVar23 = (long)(int)uVar35;
    local_e8 = (label_translation_table)dill_malloc(lVar23 * 0xc + 0xc);
    uVar26 = 0;
    uVar22 = 0;
    if (0 < (int)uVar35) {
      uVar22 = (ulong)uVar35;
    }
    piVar30 = &local_e8->old_label;
    for (; uVar22 != uVar26; uVar26 = uVar26 + 1) {
      *piVar30 = (int)uVar26;
      ((label_translation *)(piVar30 + -1))->old_location = (s->p->branch_table).label_locs[uVar26];
      piVar30 = piVar30 + 3;
    }
    iVar36 = 1;
    plVar41 = local_e8;
    for (uVar26 = 0; plVar41 = plVar41 + 1, uVar26 != uVar22; uVar26 = uVar26 + 1) {
      plVar44 = local_e8 + uVar26;
      plVar46 = plVar41;
      for (iVar45 = iVar36; iVar45 < (int)uVar35; iVar45 = iVar45 + 1) {
        if (plVar46->old_location < plVar44->old_location) {
          iVar18 = plVar44->new_label;
          local_a8 = (basic_block *)CONCAT44(local_a8._4_4_,iVar18);
          _itmpa = *(dill_stream *)plVar44;
          plVar44->new_label = plVar46->new_label;
          iVar16 = plVar46->old_label;
          plVar44->old_location = plVar46->old_location;
          plVar44->old_label = iVar16;
          plVar46->new_label = iVar18;
          *(dill_stream *)plVar46 = _itmpa;
        }
        plVar46 = plVar46 + 1;
      }
      iVar36 = iVar36 + 1;
    }
    local_e8[lVar23].old_location = -1;
    local_e8[lVar23].old_label = -1;
    local_e8[lVar23].new_label = -1;
    (*s->j->proc_start)(s,"no name",s->p->c_param_count,pmVar54->arg_info,(dill_reg *)0x0);
    for (piVar30 = &local_e8->new_label; piVar30[-1] != -1; piVar30 = piVar30 + 3) {
      iVar36 = dill_alloc_label(s,(char *)0x0);
      *piVar30 = iVar36;
    }
    if (virtual_do_end::old_reg_alloc == 0) {
      if (count_verbose == -1) {
        pcVar19 = getenv("DILL_COUNTS");
        count_verbose = (int)(pcVar19 != (char *)0x0);
      }
      local_a0 = (preg_info *)dill_malloc(4);
      local_98 = (preg_info *)dill_malloc(4);
      local_90 = 0xffffffff00000000;
      local_88 = 0xffffffff;
      local_80 = (vreg_info *)dill_malloc((long)s->p->c_param_count * 0x2c);
      pdVar29 = s->p;
      uVar26 = 0;
      uVar22 = (ulong)(uint)pdVar29->c_param_count;
      if (pdVar29->c_param_count < 1) {
        uVar22 = uVar26;
      }
      piVar30 = &local_80->value_in_mem;
      for (; uVar22 * 0x14 - uVar26 != 0; uVar26 = uVar26 + 0x14) {
        bVar55 = (&pdVar29->c_param_args->is_register)[uVar26] != '\0';
        uVar35 = 0xffffffff;
        if (bVar55) {
          uVar35 = *(uint *)((long)&pdVar29->c_param_args->in_reg + uVar26);
        }
        piVar30[-1] = 0;
        *piVar30 = (uint)!bVar55;
        piVar30[-4] = uVar35;
        piVar30 = piVar30 + 0xb;
      }
      lVar23 = 8;
      _itmpa = s;
      for (pvVar38 = (virtual_insn *)0x0; plVar41 = local_e8,
          pvVar38 < (virtual_insn *)(long)pdVar29->vreg_count;
          pvVar38 = (virtual_insn *)&pvVar38->insn_code) {
        iVar36 = dill_type_of(s,(int)pvVar38 + 100);
        pdVar29 = s->p;
        if (iVar36 == 0xc) {
          iVar36 = (*s->j->local)(s,1,*(int *)((long)&pdVar29->vregs->typ + lVar23));
          pdVar29 = s->p;
          *(int *)((long)&pdVar29->vregs->typ + lVar23) = iVar36;
        }
        lVar23 = lVar23 + 0x2c;
      }
      iVar36 = 0;
      for (uVar22 = 0; pvVar7 = local_80, pdVar11 = _itmpa, plVar46 = local_e8,
          uVar22 < (ulong)(long)pmVar54->bbcount; uVar22 = uVar22 + 1) {
        pbVar20 = pmVar54->bblist;
        bb = pbVar20 + uVar22;
        uVar26 = pbVar20[uVar22].start;
        uVar50 = pbVar20[uVar22].end;
        pdVar29 = s->p;
        lVar25 = (long)pdVar29->vreg_count;
        lVar23 = 0x28;
        while (bVar55 = lVar25 != 0, lVar25 = lVar25 + -1, bVar55) {
          pvVar9 = pdVar29->vregs;
          puVar2 = (undefined8 *)((long)pvVar9 + lVar23 + -0x14);
          *puVar2 = 0xffffffffffffffff;
          puVar2[1] = 0xffffffff;
          *(undefined8 *)((long)pvVar9 + lVar23 + -4) = 0xffffffff00000000;
          lVar23 = lVar23 + 0x2c;
        }
        lVar23 = (long)pdVar29->c_param_count;
        local_c0 = &local_80->value_in_mem;
        piVar30 = local_c0;
        while (bVar55 = lVar23 != 0, lVar23 = lVar23 + -1, uVar31 = uVar50, uVar51 = uVar26, bVar55)
        {
          *(undefined8 *)(piVar30 + -5) = 0xffffffffffffffff;
          *(undefined8 *)(piVar30 + -3) = 0xffffffff;
          *(undefined8 *)(piVar30 + -1) = 0xffffffff00000000;
          piVar30 = piVar30 + 0xb;
        }
        for (; uVar51 <= uVar31; uVar51 = uVar51 + 1) {
          insn_uses(insns + uVar51,&itmpb);
          local_6c = insn_defines(insns + uVar51);
          for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
            uVar35 = (&itmpb)[lVar23];
            if ((ulong)uVar35 != 0xffffffff) {
              if (lVar23 != 3) {
                pdVar29 = pdVar11->p;
                if ((int)uVar35 < 100) {
                  if (pdVar29->c_param_args[(int)uVar35].is_register != '\0') goto LAB_0010f12a;
                  pvVar9 = pvVar7 + (int)uVar35;
                }
                else {
                  pvVar9 = pdVar29->vregs + ((ulong)uVar35 - 100);
                }
                pvVar9->last_use = (int)uVar51;
              }
LAB_0010f12a:
              iVar17 = value_in_mem((reg_state *)&itmpa,uVar35);
              if (iVar17 == -1) {
                set_value_in_mem((reg_state *)&itmpa,uVar35,(int)uVar51);
              }
              pdVar29 = pdVar11->p;
              if ((int)uVar35 < 100) {
                if (pdVar29->c_param_args[(int)uVar35].is_register != '\0') goto LAB_0010f196;
                pvVar9 = pvVar7 + (int)uVar35;
              }
              else {
                pvVar9 = pdVar29->vregs + (long)(int)uVar35 + -100;
              }
              pvVar9->use_metric = pvVar9->use_metric + 1;
            }
LAB_0010f196:
          }
          uVar31 = bb->end;
        }
        local_120 = (int)uVar26;
        uVar35 = (int)uVar50 - local_120;
        pdVar29 = s->p;
        iVar17 = pdVar29->vreg_count;
        lVar23 = 0x28;
        for (lVar25 = 0; pmVar54 = local_e0, iVar17 != lVar25; lVar25 = lVar25 + 1) {
          uVar12 = (uint)lVar25;
          iVar45 = get_last_use((reg_state *)&itmpa,uVar12 + 100);
          if (iVar45 != -1) {
            pvVar7 = pdVar29->vregs;
            *(int *)((long)pvVar7 + lVar23 + -8) =
                 (int)(*(int *)((long)pvVar7 + lVar23 + -8) * uVar35) /
                 ((*(int *)((long)pvVar7 + lVar23 + -0xc) - *(int *)((long)&pvVar7->typ + lVar23)) +
                 1);
            *(uint *)((long)&pvVar7->typ + lVar23) =
                 (uint)(((uint)(int)bb->regs_used->vec[(int)uVar12 >> 3] >> (uVar12 & 7) & 1) != 0);
          }
          lVar23 = lVar23 + 0x2c;
        }
        lVar25 = (long)pdVar29->c_param_count;
        lVar23 = 4;
        piVar30 = local_c0;
        while (bVar55 = lVar25 != 0, lVar25 = lVar25 + -1, bVar55) {
          bVar55 = *(char *)((long)pdVar29->c_param_args + lVar23 + -3) != '\0';
          uVar12 = 0xffffffff;
          if (bVar55) {
            uVar12 = *(uint *)(&pdVar29->c_param_args->type + lVar23);
          }
          piVar30[-1] = 0;
          *piVar30 = (uint)!bVar55;
          piVar30[-4] = uVar12;
          piVar30 = piVar30 + 0xb;
          lVar23 = lVar23 + 0x14;
        }
        uVar26 = local_90 & 0xffffffff;
        if ((int)local_90 < 1) {
          uVar26 = 0;
        }
        for (uVar50 = 0; uVar26 != uVar50; uVar50 = uVar50 + 1) {
          local_98[uVar50].holds = -1;
          local_a0[uVar50].holds = -1;
        }
        if (s->dill_debug != 0) {
          printf("============= Starting basic block %zd ===========\n",uVar22);
          dump_bb(s,bb,(int)uVar22);
          pdVar29 = s->p;
        }
        local_d0 = pdVar29->code_base;
        local_c8 = pdVar29->cur_ip;
        for (pvVar38 = (virtual_insn *)bb->start; pvVar38 <= (virtual_insn *)bb->end;
            pvVar38 = (virtual_insn *)&pvVar38->insn_code) {
          pvVar40 = insns + (long)pvVar38;
          local_f0 = (ulong)insns[(long)pvVar38].insn_code;
          iVar17 = (int)pvVar38;
          local_a8 = bb;
          for (piVar30 = &plVar41[iVar36].new_label;
              ((label_translation *)(piVar30 + -2))->old_location == iVar17 * 0x28;
              piVar30 = piVar30 + 3) {
            dill_mark_label(s,*piVar30);
            iVar36 = iVar36 + 1;
          }
          if (s->dill_debug != 0) {
            pvVar27 = (void *)(ulong)(uint)(iVar17 * 0x28);
            printf("   v    loc(%d)  ");
            virtual_print_insn(s,pvVar27,pvVar40);
            putchar(10);
          }
          if (pvVar38 == (virtual_insn *)bb->end) {
            spill_current_pregs((reg_state *)&itmpa);
          }
          insn_uses(pvVar40,&itmpb);
          uVar12 = insn_defines(pvVar40);
          lVar23 = (long)(int)local_88;
          pvVar39 = extraout_RDX_25;
          if (lVar23 != -1) {
            pvVar7 = s->p->vregs;
            pvVar39 = (virtual_insn *)(long)pvVar7[lVar23 + -100].last_use;
            if (pvVar38 == pvVar39) {
              pvVar7[lVar23 + -100].in_reg = local_90._4_4_;
            }
            else {
              iVar45 = select_reg((reg_state *)&itmpa,local_88,iVar17,0);
              p_Var10 = s->j->mov;
              iVar18 = dill_type_of(s,local_88);
              (*p_Var10)(s,iVar18,0,iVar45,local_90._4_4_);
              pvVar39 = extraout_RDX_26;
            }
            local_88 = 0xffffffff;
          }
          for (lVar23 = 0; (lVar23 != 3 && ((&itmpb)[lVar23] != -1)); lVar23 = lVar23 + 1) {
            iVar45 = select_reg((reg_state *)&itmpa,(&itmpb)[lVar23],iVar17,1);
            (&dtmpa)[lVar23] = iVar45;
            pvVar39 = extraout_RDX_27;
          }
          iVar45 = -1;
          if (uVar12 != 0xffffffff) {
            iVar45 = select_reg((reg_state *)&itmpa,uVar12,iVar17,0);
            pvVar39 = extraout_RDX_28;
          }
          local_c0 = (int *)(long)(int)uVar12;
          if ((s->dill_debug != 0) && ((uVar12 != 0xffffffff || (itmpb != -1)))) {
            printf("\tvregs\t\t");
            if (uVar12 != 0xffffffff) {
              uVar26 = 0x50;
              if (99 < (int)uVar12) {
                iVar17 = dill_type_of(s,uVar12);
                uVar26 = (ulong)((uint)(iVar17 != 0xc) << 4 | 0x42);
              }
              printf(" %c%d = ",uVar26,(ulong)uVar12);
              iVar17 = dill_type_of(s,(int)local_c0);
              dill_dump_reg(s,iVar17,iVar45);
              printf("(%d) - ");
            }
            for (lVar23 = 0; (lVar23 != 3 && (uVar43 = (&itmpb)[lVar23], uVar43 != 0xffffffff));
                lVar23 = lVar23 + 1) {
              uVar26 = 0x50;
              if (99 < (int)uVar43) {
                iVar17 = dill_type_of(s,uVar43);
                uVar26 = (ulong)((uint)(iVar17 != 0xc) << 4 | 0x42);
              }
              printf(" %c%d = ",uVar26,(ulong)uVar43);
              iVar17 = dill_type_of(s,uVar43);
              dill_dump_reg(s,iVar17,(&dtmpa)[lVar23]);
              printf("(%d) - ");
            }
            putchar(10);
            pvVar39 = extraout_RDX_29;
          }
          switch(pvVar40->class_code) {
          case '\0':
            pp_Var49 = s->j->jmp_a3;
            pjVar32 = s->j->a3_data;
            goto LAB_0010fa30;
          case '\x01':
            pjVar32 = s->j->a3i_data;
            (*s->j->jmp_a3i[local_f0])
                      (s,(int)pjVar32[local_f0].data1,(int)pjVar32[local_f0].data2,iVar45,dtmpa,
                       (pvVar40->opnds).spec.param);
            break;
          case '\x02':
            pjVar32 = s->j->a2_data;
            (*s->j->jmp_a2[local_f0])
                      (s,(int)pjVar32[local_f0].data1,(int)pjVar32[local_f0].data2,iVar45,dtmpa);
            break;
          case '\x03':
            (*s->j->ret)(s,(int)pvVar40->insn_code,0,dtmpa);
            break;
          case '\x04':
            (*s->j->convert)(s,(uint)((byte)pvVar40->insn_code >> 4),(byte)pvVar40->insn_code & 0xf,
                             iVar45,dtmpa);
            break;
          case '\x05':
            bVar5 = pvVar40->insn_code;
            uVar43 = bVar5 & 0xf;
            if ((bVar5 & 0x10) == 0) {
              if ((bVar5 & 0x20) == 0) {
                (*s->j->load)(s,uVar43,0,iVar45,dtmpa,local_f8);
              }
              else {
                (*s->j->bsload)(s,uVar43,0,iVar45,dtmpa,local_f8);
              }
            }
            else {
              (*s->j->store)(s,uVar43,0,local_f4,dtmpa,local_f8);
            }
            break;
          case '\x06':
            bVar5 = pvVar40->insn_code;
            uVar43 = bVar5 & 0xf;
            if ((bVar5 & 0x10) == 0) {
              lVar23 = (pvVar40->opnds).spec.param;
              if ((bVar5 & 0x20) == 0) {
                (*s->j->loadi)(s,uVar43,0,iVar45,dtmpa,lVar23);
              }
              else {
                (*s->j->bsloadi)(s,uVar43,0,iVar45,dtmpa,lVar23);
              }
            }
            else {
              (*s->j->storei)(s,uVar43,0,local_f8,dtmpa,(pvVar40->opnds).spec.param);
            }
            break;
          case '\a':
            (*s->j->set)(s,(byte)pvVar40->insn_code & 0xf,0,iVar45,(pvVar40->opnds).spec.param);
            break;
          case '\b':
            (*s->j->setf)(s,(byte)pvVar40->insn_code & 0xf,0,iVar45,(pvVar40->opnds).sf.imm);
            break;
          case '\t':
            (*s->j->mov)(s,(byte)pvVar40->insn_code & 0xf,0,iVar45,dtmpa);
            break;
          case '\n':
            (*s->j->reti)(s,(byte)pvVar40->insn_code & 0xf,0,(pvVar40->opnds).spec.param);
            break;
          case '\v':
            cVar4 = pvVar40->insn_code;
            iVar17 = get_new_label((pvVar40->opnds).a3.src2,local_e8);
            pjVar32 = s->j->b_data;
            (*s->j->jmp_b[cVar4])
                      (s,(int)pjVar32[cVar4].data1,(int)pjVar32[cVar4].data2,dtmpa,local_f8,iVar17);
            break;
          case '\f':
            cVar4 = pvVar40->insn_code;
            iVar17 = get_new_label((pvVar40->opnds).a3.src1,local_e8);
            pjVar32 = s->j->b_data;
            (*s->j->jmp_bi[cVar4])
                      (s,(int)pjVar32[cVar4].data1,(int)pjVar32[cVar4].data2,dtmpa,
                       (pvVar40->opnds).bri.imm_l,iVar17);
            break;
          case '\r':
            iVar17 = get_new_label((pvVar40->opnds).a3.src2,local_e8);
            (*s->j->jv)(s,(long)iVar17);
            break;
          case '\x0e':
            p_Var8 = s->j->special;
            if (p_Var8 != (special_op)0x0) {
              (*p_Var8)(s,(pvVar40->opnds).spec.type,(pvVar40->opnds).spec.param);
            }
            break;
          case '\x0f':
            (*s->j->jp)(s,(long)dtmpa);
            break;
          case '\x10':
            (*s->j->jpi)(s,(pvVar40->opnds).bri.imm_a);
            break;
          case '\x11':
            local_f0 = CONCAT44(local_f0._4_4_,uVar12);
            bVar5 = pvVar40->insn_code;
            if ((undefined1  [32])((undefined1  [32])pvVar40->opnds & (undefined1  [32])0x8000) ==
                (undefined1  [32])0x0) {
              pjVar33 = s->j;
              iVar17 = dtmpa;
            }
            else {
              pushpop_inuse_regs(s,0,pvVar39);
              pjVar33 = s->j;
              iVar17 = (int)*(short *)&pvVar40->opnds;
            }
            (*pjVar33->push)(s,bVar5 & 0xf,iVar17);
            uVar12 = (uint)local_f0;
            break;
          case '\x12':
            if ((pvVar40->insn_code & 0xfU) == 8) {
              (*s->j->pushpi)(s,8,(pvVar40->opnds).bri.imm_a);
            }
            else {
              (*s->j->pushi)(s,4,(pvVar40->opnds).spec.param);
            }
            break;
          case '\x13':
            (*s->j->pushfi)(s,(byte)pvVar40->insn_code & 0xf,(pvVar40->opnds).sf.imm);
            break;
          case '\x14':
            uVar43 = (byte)pvVar40->insn_code & 0xf;
            if ((pvVar40->insn_code & 0x10U) == 0) {
              iVar17 = (*s->j->calli)(s,uVar43,(pvVar40->opnds).bri.imm_a,
                                      (pvVar40->opnds).calli.xfer_name);
              pvVar40 = extraout_RDX_30;
            }
            else {
              iVar17 = (*s->j->callr)(s,uVar43,dtmpa);
              pvVar40 = extraout_RDX_31;
            }
            local_90 = CONCAT44(iVar17,(int)local_90);
            local_88 = uVar12;
            pushpop_inuse_regs(s,1,pvVar40);
            break;
          case '\x15':
            iVar17 = (pvVar40->opnds).a3.src2;
            iVar18 = offset_of(s,itmpb);
            pjVar33 = s->j;
            iVar18 = iVar18 + iVar17;
            if (iVar18 == 0) {
              (*pjVar33->mov)(s,8,0,iVar45,s->dill_local_pointer);
            }
            else {
              (*pjVar33->jmp_a3i[0x28])
                        (s,(int)pjVar33->a3i_data[0x28].data1,(int)pjVar33->a3i_data[0x28].data2,
                         iVar45,s->dill_local_pointer,(long)iVar18);
            }
            break;
          case '\x16':
            pp_Var49 = s->j->jmp_c;
            pjVar32 = s->j->c_data;
LAB_0010fa30:
            (*pp_Var49[local_f0])
                      (s,(int)pjVar32[local_f0].data1,(int)pjVar32[local_f0].data2,iVar45,dtmpa,
                       local_f8);
          }
          if ((uVar12 != 0xffffffff) && (iVar45 == -1)) {
            iVar17 = offset_of(s,uVar12);
            iVar45 = dill_type_of(s,(int)local_c0);
            set_value_in_mem((reg_state *)&itmpa,uVar12,1);
            set_update_in_reg((reg_state *)&itmpa,uVar12,0);
            if (iVar17 == -0x21524111) {
              iVar17 = (*s->j->local)(s,0,iVar45);
              s->p->vregs[(long)(local_c0 + -0x19)].offset = iVar17;
            }
            (*s->j->storei)(s,iVar45,0,-1,(&s->dill_local_pointer)[(int)uVar12 < 100],(long)iVar17);
            set_in_reg((reg_state *)&itmpa,uVar12,-1);
            local_88 = 0xffffffff;
          }
          pmVar54 = local_e0;
        }
        spill_current_pregs((reg_state *)&itmpa);
        if (count_verbose != 0) {
          uVar12 = (*s->j->count_insn)(s,(int)local_c8 - (uint)local_d0,
                                       *(int *)&s->p->cur_ip - *(int *)&s->p->code_base);
          printf("Basic Block %zd, %d virtual instructions, %d physical instructions\n",uVar22,
                 (ulong)uVar35,(ulong)uVar12);
        }
      }
      uVar26 = (ulong)iVar36;
      uVar22 = (ulong)(uint)local_e8[uVar26].old_location;
      if ((long)pvVar38 * 0x28 - uVar22 == 0) {
        dill_mark_label(s,local_e8[uVar26].new_label);
        uVar26 = (ulong)(iVar36 + 1);
        uVar22 = (ulong)(uint)plVar46[uVar26].old_location;
      }
      if ((int)uVar22 != -1) {
        plVar41 = local_e8 + uVar26;
        while( true ) {
          pmVar54 = local_e0;
          iVar36 = (int)uVar22;
          if (iVar36 != (int)pvVar38 * 0x28) break;
          dill_mark_label(s,plVar41->new_label);
          uVar22 = (ulong)(uint)plVar41[1].old_location;
          uVar26 = (ulong)((int)uVar26 + 1);
          plVar41 = plVar41 + 1;
        }
        if (iVar36 != -1) {
          printf("Some labels2 (%d, old loc %d name \"%s\") not placed\n",uVar26 & 0xffffffff,uVar22
                 ,(s->p->branch_table).label_name[iVar36]);
        }
      }
      free(local_a0);
      free(local_98);
      free(local_80);
      plVar41 = local_e8;
    }
    else {
      iVar36 = dill_raw_getreg(s,&itmpa,6,1);
      if ((iVar36 == 0) || (iVar36 = dill_raw_getreg(s,&itmpb,6,1), iVar36 == 0)) {
        fwrite("Failure to get temporary regs in register assign\n",0x31,1,_stderr);
      }
      dill_raw_getreg(s,&dtmpa,10,1);
      dill_raw_getreg(s,&local_34,10,1);
      pdVar29 = s->p;
      uVar35 = 0xfffffff7;
      for (lVar23 = 0x1e0; lVar23 != 0x270; lVar23 = lVar23 + 0xc) {
        piVar47 = &itmpa;
        piVar30 = &pdVar29->machine_strr_tmp_reg;
        if (uVar35 < 2) {
          piVar47 = &dtmpa;
          piVar30 = &dtmpa;
        }
        *(int *)((long)pdVar29 + lVar23 + -8) = *piVar47;
        pdVar48 = &itmpb;
        if (uVar35 < 2) {
          pdVar48 = &local_34;
        }
        *(dill_reg *)((long)pdVar29 + lVar23 + -4) = *pdVar48;
        *(int *)((long)&pdVar29->code_base + lVar23) = *piVar30;
        uVar35 = uVar35 + 1;
      }
      for (lVar23 = 0; lVar23 < pmVar54->bbcount; lVar23 = lVar23 + 1) {
        pbVar20 = pmVar54->bblist;
        __s = (short *)dill_malloc((long)pdVar29->vreg_count * 2);
        pbVar20[lVar23].reg_assigns = __s;
        memset(__s,0xff,(long)s->p->vreg_count * 2);
        foreach_bit(pbVar20[lVar23].regs_defined,do_reg_assign,pbVar20 + lVar23,s);
        lVar52 = 0;
        for (lVar25 = 0; pdVar29 = s->p, lVar25 < pdVar29->vreg_count; lVar25 = lVar25 + 1) {
          iVar36 = (int)pbVar20[lVar23].reg_assigns[lVar25];
          if (iVar36 != -1) {
            dill_raw_putreg(s,iVar36,*(int *)((long)&pdVar29->vregs->typ + lVar52));
          }
          lVar52 = lVar52 + 0x2c;
        }
        pmVar54 = local_e0;
      }
      uVar26 = (ulong)(iVar17 - 100);
      lVar23 = 8;
      for (uVar22 = 0; (long)uVar22 < (long)pdVar29->vreg_count; uVar22 = uVar22 + 1) {
        if (uVar26 == uVar22) {
          pvVar7 = pdVar29->vregs;
          pvVar7[uVar26].preg = s->dill_local_pointer;
          pvVar7[uVar26].offset = 0;
        }
        else {
          pvVar7 = pdVar29->vregs;
          iVar36 = *(int *)((long)pvVar7 + lVar23 + -8);
          if (iVar36 == 0xc) {
            iVar36 = *(int *)((long)&pvVar7->typ + lVar23);
            *(undefined4 *)((long)pvVar7 + lVar23 + -4) = 0xffffffff;
            pjVar33 = s->j;
            iVar17 = 1;
          }
          else {
            *(undefined4 *)((long)pvVar7 + lVar23 + -4) = 0xffffffff;
            if (iVar36 == 0xb) {
              puts("internal void register error");
              pdVar29 = s->p;
              goto LAB_0010d74f;
            }
            pjVar33 = s->j;
            iVar17 = 0;
          }
          iVar36 = (*pjVar33->local)(s,iVar17,iVar36);
          pdVar29 = s->p;
          *(int *)((long)&pdVar29->vregs->typ + lVar23) = iVar36;
        }
LAB_0010d74f:
        lVar23 = lVar23 + 0x2c;
      }
      if (count_verbose == -1) {
        pcVar19 = getenv("DILL_COUNTS");
        count_verbose = (int)(pcVar19 != (char *)0x0);
      }
      local_c0 = &local_e8->new_label;
      pcVar19 = (char *)0x0;
      uVar22 = 0;
      for (uVar26 = 0; plVar41 = local_e8, uVar26 < (ulong)(long)local_e0->bbcount;
          uVar26 = uVar26 + 1) {
        pbVar24 = local_e0->bblist;
        pbVar20 = pbVar24 + uVar26;
        local_60 = s->p->code_base;
        local_58 = s->p->cur_ip;
        local_68 = pbVar24[uVar26].start;
        local_50 = pbVar24[uVar26].end;
        info_ptr = emit_getreg;
        local_48 = uVar26;
        foreach_bit(pbVar24[uVar26].regs_defined,emit_getreg,pbVar20,s);
        iVar36 = 0;
        uVar35 = 0xffffffff;
        pvVar38 = extraout_RDX;
        local_40 = uVar26 * 0x68;
        for (pcVar19 = (char *)pbVar24[uVar26].start; pcVar19 <= (char *)pbVar20->end;
            pcVar19 = pcVar19 + 1) {
          pvVar40 = insns + (long)pcVar19;
          uVar12 = (int)pcVar19 * 0x28;
          uVar50 = (ulong)(int)uVar22;
          uVar26 = uVar50;
          for (piVar30 = local_c0 + uVar50 * 3;
              (uVar22 = uVar50, uVar12 != 0 &&
              (uVar22 = uVar26, ((label_translation *)(piVar30 + -2))->old_location == uVar12));
              piVar30 = piVar30 + 3) {
            info_ptr = (code *)(ulong)(uint)*piVar30;
            dill_mark_label(s,*piVar30);
            uVar26 = uVar26 + 1;
            pvVar38 = extraout_RDX_00;
          }
          if (s->dill_debug != 0) {
            printf("   v    ");
            virtual_print_insn(s,info_ptr,pvVar40);
            putchar(10);
            pvVar38 = extraout_RDX_01;
          }
          if (0x16 < (byte)pvVar40->class_code) goto LAB_0010ed87;
          switch(pvVar40->class_code) {
          case '\0':
            uVar12 = (pvVar40->opnds).a3.dest;
            uVar43 = (pvVar40->opnds).a3.src1;
            uVar42 = (pvVar40->opnds).a3.src2;
            local_c8 = (char *)CONCAT44(local_c8._4_4_,(int)pvVar40->insn_code);
            local_f0 = uVar22;
            if ((uVar35 == uVar42) &&
               (iVar17 = is_commutative((int)pvVar40->insn_code), uVar42 = uVar35, iVar17 != 0)) {
              uVar42 = (pvVar40->opnds).a3.src1;
              uVar43 = (pvVar40->opnds).a3.src2;
            }
            iVar17 = preg_of(s,pbVar20,uVar12);
            local_d0 = (char *)CONCAT44(local_d0._4_4_,iVar17);
            iVar17 = preg_of(s,pbVar20,uVar43);
            uVar14 = preg_of(s,pbVar20,uVar42);
            if (iVar17 == -1) {
              local_d4 = uVar14;
              if ((uVar35 == uVar43) && (iVar17 = tmp_for_vreg(s,uVar35,vreg_10), iVar17 != -1)) {
                iVar45 = has_single_def_use(s,uVar35);
                iVar17 = extraout_EDX_23;
                if (iVar45 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar17 = extraout_EDX_24;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar17 = tmp_for_vreg(s,uVar35,iVar17);
                uVar14 = local_d4;
              }
              else {
                iVar17 = load_oprnd(s,0,uVar43);
                uVar14 = local_d4;
              }
            }
            uVar22 = local_f0;
            if (uVar14 == 0xffffffff) {
              uVar14 = load_oprnd(s,1,uVar42);
            }
            iVar45 = (uint)local_d0;
            if ((uint)local_d0 == -1) {
              pdVar29 = s->p;
              iVar45 = dill_type_of(s,uVar12);
              iVar45 = pdVar29->v_tmps[iVar45][0];
            }
            lVar23 = (long)(int)local_c8;
            pjVar32 = s->j->a3_data;
            (*s->j->jmp_a3[lVar23])
                      (s,(int)pjVar32[lVar23].data1,(int)pjVar32[lVar23].data2,iVar45,iVar17,uVar14)
            ;
            goto LAB_0010ec61;
          case '\x01':
            uVar12 = (pvVar40->opnds).a3.dest;
            uVar43 = (pvVar40->opnds).a3.src1;
            lVar23 = (pvVar40->opnds).spec.param;
            iVar17 = preg_of(s,pbVar20,uVar12);
            iVar45 = preg_of(s,pbVar20,uVar43);
            cVar4 = pvVar40->insn_code;
            if (iVar45 == -1) {
              if ((uVar35 == uVar43) && (iVar45 = tmp_for_vreg(s,uVar35,vreg_06), iVar45 != -1)) {
                iVar18 = has_single_def_use(s,uVar35);
                iVar45 = extraout_EDX_13;
                if (iVar18 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar45 = extraout_EDX_14;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar45 = tmp_for_vreg(s,uVar35,iVar45);
              }
              else {
                iVar45 = load_oprnd(s,0,uVar43);
              }
            }
            if (iVar17 == -1) {
              pdVar29 = s->p;
              iVar17 = dill_type_of(s,uVar12);
              iVar17 = pdVar29->v_tmps[iVar17][0];
            }
            pjVar32 = s->j->a3i_data;
            (*s->j->jmp_a3i[cVar4])
                      (s,(int)pjVar32[cVar4].data1,(int)pjVar32[cVar4].data2,iVar17,iVar45,lVar23);
            goto LAB_0010ea05;
          case '\x02':
            uVar12 = (pvVar40->opnds).a3.dest;
            uVar43 = (pvVar40->opnds).a3.src1;
            iVar17 = preg_of(s,pbVar20,uVar12);
            iVar45 = preg_of(s,pbVar20,uVar43);
            cVar4 = pvVar40->insn_code;
            if (iVar45 == -1) {
              if ((uVar35 == uVar43) && (iVar45 = tmp_for_vreg(s,uVar35,vreg_03), iVar45 != -1)) {
                iVar18 = has_single_def_use(s,uVar35);
                iVar45 = extraout_EDX_07;
                if (iVar18 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar45 = extraout_EDX_08;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar45 = tmp_for_vreg(s,uVar35,iVar45);
              }
              else {
                iVar45 = load_oprnd(s,0,uVar43);
              }
            }
            if (iVar17 == -1) {
              pdVar29 = s->p;
              iVar17 = dill_type_of(s,uVar12);
              iVar17 = pdVar29->v_tmps[iVar17][0];
            }
            pjVar32 = s->j->a2_data;
            (*s->j->jmp_a2[cVar4])
                      (s,(int)pjVar32[cVar4].data1,(int)pjVar32[cVar4].data2,iVar17,iVar45);
            goto LAB_0010ea05;
          case '\x03':
            uVar12 = (pvVar40->opnds).a3.dest;
            iVar17 = preg_of(s,pbVar20,uVar12);
            if (iVar17 == -1) {
              if ((uVar35 == uVar12) && (iVar17 = tmp_for_vreg(s,uVar35,vreg_05), iVar17 != -1)) {
                iVar45 = has_single_def_use(s,uVar35);
                iVar17 = extraout_EDX_11;
                if (iVar45 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar17 = extraout_EDX_12;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar17 = tmp_for_vreg(s,uVar35,iVar17);
              }
              else {
                iVar17 = load_oprnd(s,0,uVar12);
              }
            }
            info_ptr = (code *)(ulong)(uint)(int)pvVar40->insn_code;
            (*s->j->ret)(s,(int)pvVar40->insn_code,0,iVar17);
            pvVar38 = extraout_RDX_13;
            break;
          case '\x04':
            uVar12 = (pvVar40->opnds).a3.dest;
            uVar43 = (pvVar40->opnds).a3.src1;
            iVar17 = preg_of(s,pbVar20,uVar12);
            iVar45 = preg_of(s,pbVar20,uVar43);
            bVar5 = pvVar40->insn_code;
            if (iVar45 == -1) {
              if ((uVar35 == uVar43) && (iVar45 = tmp_for_vreg(s,uVar35,vreg_00), iVar45 != -1)) {
                iVar18 = has_single_def_use(s,uVar35);
                iVar45 = extraout_EDX_01;
                if (iVar18 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar45 = extraout_EDX_02;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar45 = tmp_for_vreg(s,uVar35,iVar45);
              }
              else {
                iVar45 = load_oprnd(s,0,uVar43);
              }
            }
            if (iVar17 == -1) {
              pdVar29 = s->p;
              iVar17 = dill_type_of(s,uVar12);
              iVar17 = pdVar29->v_tmps[iVar17][0];
            }
            (*s->j->convert)(s,(uint)(bVar5 >> 4),bVar5 & 0xf,iVar17,iVar45);
            goto LAB_0010ea05;
          case '\x05':
            iVar17 = (pvVar40->opnds).a3.dest;
            uVar12 = (pvVar40->opnds).a3.src1;
            uVar43 = (pvVar40->opnds).a3.src2;
            bVar5 = pvVar40->insn_code;
            uVar42 = uVar12;
            if (uVar35 == uVar43) {
              uVar42 = uVar43;
              uVar43 = uVar12;
            }
            local_d0 = (char *)CONCAT44(local_d0._4_4_,iVar17);
            local_f0 = uVar22;
            local_c8 = pcVar19;
            iVar17 = preg_of(s,pbVar20,iVar17);
            iVar45 = preg_of(s,pbVar20,uVar42);
            local_d4 = uVar43;
            iVar18 = preg_of(s,pbVar20,uVar43);
            if (iVar45 == -1) {
              if ((uVar35 == uVar42) && (iVar45 = tmp_for_vreg(s,uVar35,vreg_07), iVar45 != -1)) {
                iVar16 = has_single_def_use(s,uVar35);
                iVar45 = extraout_EDX_17;
                if (iVar16 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar45 = extraout_EDX_18;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar45 = tmp_for_vreg(s,uVar35,iVar45);
              }
              else {
                iVar45 = load_oprnd(s,0,uVar42);
              }
            }
            if (iVar18 == -1) {
              iVar18 = load_oprnd(s,1,local_d4);
            }
            pcVar19 = local_c8;
            uVar22 = local_f0;
            uVar35 = bVar5 & 0xf;
            if ((bVar5 & 0x10) != 0) {
              if (iVar17 == -1) {
                iVar17 = load_oprnd(s,2,(uint)local_d0);
              }
              info_ptr = (code *)(ulong)uVar35;
              (*s->j->store)(s,uVar35,0,iVar17,iVar45,iVar18);
              pvVar38 = extraout_RDX_14;
              break;
            }
            if (iVar17 == -1) {
              pdVar29 = s->p;
              iVar17 = dill_type_of(s,(uint)local_d0);
              iVar17 = pdVar29->v_tmps[iVar17][0];
            }
            (**(code **)((long)&s->j->load + (ulong)((bVar5 & 0x20) >> 2)))
                      (s,uVar35,0,iVar17,iVar45,iVar18);
            uVar12 = (uint)local_d0;
            goto LAB_0010ec61;
          case '\x06':
            uVar12 = (pvVar40->opnds).a3.dest;
            uVar43 = (pvVar40->opnds).a3.src1;
            lVar23 = (pvVar40->opnds).spec.param;
            iVar17 = preg_of(s,pbVar20,uVar12);
            iVar45 = preg_of(s,pbVar20,uVar43);
            bVar5 = pvVar40->insn_code;
            if (iVar45 == -1) {
              if ((uVar35 == uVar43) && (iVar45 = tmp_for_vreg(s,uVar35,vreg_09), iVar45 != -1)) {
                iVar18 = has_single_def_use(s,uVar35);
                iVar45 = extraout_EDX_21;
                if (iVar18 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar45 = extraout_EDX_22;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar45 = tmp_for_vreg(s,uVar35,iVar45);
              }
              else {
                iVar45 = load_oprnd(s,0,uVar43);
              }
            }
            uVar35 = bVar5 & 0xf;
            if ((bVar5 & 0x10) != 0) {
              if (iVar17 == -1) {
                iVar17 = load_oprnd(s,1,uVar12);
              }
              info_ptr = (code *)(ulong)uVar35;
              (*s->j->storei)(s,uVar35,0,iVar17,iVar45,lVar23);
              pvVar38 = extraout_RDX_17;
              break;
            }
            if (iVar17 == -1) {
              pdVar29 = s->p;
              iVar17 = dill_type_of(s,uVar12);
              iVar17 = pdVar29->v_tmps[iVar17][0];
            }
            (**(code **)((long)&s->j->loadi + (ulong)((bVar5 & 0x20) >> 2)))
                      (s,uVar35,0,iVar17,iVar45,lVar23);
            goto LAB_0010ec61;
          case '\a':
            uVar12 = (pvVar40->opnds).a3.dest;
            lVar23 = (pvVar40->opnds).spec.param;
            iVar17 = preg_of(s,pbVar20,uVar12);
            bVar5 = pvVar40->insn_code;
            if (iVar17 == -1) {
              pdVar29 = s->p;
              iVar17 = dill_type_of(s,uVar12);
              iVar17 = pdVar29->v_tmps[iVar17][0];
            }
            (*s->j->set)(s,bVar5 & 0xf,0,iVar17,lVar23);
            goto LAB_0010ec61;
          case '\b':
            uVar12 = (pvVar40->opnds).a3.dest;
            dVar3 = (pvVar40->opnds).sf.imm;
            iVar17 = preg_of(s,pbVar20,uVar12);
            bVar5 = pvVar40->insn_code;
            if (iVar17 == -1) {
              pdVar29 = s->p;
              iVar17 = dill_type_of(s,uVar12);
              iVar17 = pdVar29->v_tmps[iVar17][0];
            }
            (*s->j->setf)(s,bVar5 & 0xf,0,iVar17,dVar3);
            goto LAB_0010ec61;
          case '\t':
            uVar12 = (pvVar40->opnds).a3.dest;
            uVar43 = (pvVar40->opnds).a3.src1;
            iVar17 = preg_of(s,pbVar20,uVar12);
            iVar45 = preg_of(s,pbVar20,uVar43);
            bVar5 = pvVar40->insn_code;
            if (iVar45 == -1) {
              if ((uVar35 == uVar43) && (iVar45 = tmp_for_vreg(s,uVar35,vreg_02), iVar45 != -1)) {
                iVar18 = has_single_def_use(s,uVar35);
                iVar45 = extraout_EDX_05;
                if (iVar18 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar45 = extraout_EDX_06;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar45 = tmp_for_vreg(s,uVar35,iVar45);
              }
              else {
                iVar45 = load_oprnd(s,0,uVar43);
              }
            }
            if (iVar17 == -1) {
              pdVar29 = s->p;
              iVar17 = dill_type_of(s,uVar12);
              iVar17 = pdVar29->v_tmps[iVar17][0];
            }
            (*s->j->mov)(s,bVar5 & 0xf,0,iVar17,iVar45);
            goto LAB_0010ea05;
          case '\n':
            uVar35 = (byte)pvVar40->insn_code & 0xf;
            info_ptr = (code *)(ulong)uVar35;
            (*s->j->reti)(s,uVar35,0,(pvVar40->opnds).spec.param);
            pvVar38 = extraout_RDX_07;
            break;
          case '\v':
            cVar4 = pvVar40->insn_code;
            iVar45 = get_new_label((pvVar40->opnds).a3.src2,local_e8);
            uVar12 = (pvVar40->opnds).a3.dest;
            iVar17 = (pvVar40->opnds).a3.src1;
            iVar18 = preg_of(s,pbVar20,uVar12);
            iVar16 = preg_of(s,pbVar20,iVar17);
            if (iVar18 == -1) {
              if ((uVar35 == uVar12) && (iVar18 = tmp_for_vreg(s,uVar35,vreg), iVar18 != -1)) {
                iVar15 = has_single_def_use(s,uVar35);
                iVar18 = extraout_EDX;
                if (iVar15 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar18 = extraout_EDX_00;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar18 = tmp_for_vreg(s,uVar35,iVar18);
              }
              else {
                iVar18 = load_oprnd(s,0,uVar12);
              }
            }
            if (iVar16 == -1) {
              iVar16 = load_oprnd(s,1,iVar17);
            }
            pjVar32 = s->j->b_data;
            uVar35 = (uint)pjVar32[cVar4].data1;
            info_ptr = (code *)(ulong)uVar35;
            (*s->j->jmp_b[cVar4])(s,uVar35,(int)pjVar32[cVar4].data2,iVar18,iVar16,iVar45);
            pvVar38 = extraout_RDX_10;
            break;
          case '\f':
            cVar4 = pvVar40->insn_code;
            local_f0 = uVar22;
            iVar17 = get_new_label((pvVar40->opnds).a3.src1,local_e8);
            uVar12 = (pvVar40->opnds).a3.dest;
            lVar23 = (pvVar40->opnds).bri.imm_l;
            iVar45 = preg_of(s,pbVar20,uVar12);
            if (iVar45 == -1) {
              if ((uVar35 == uVar12) && (iVar45 = tmp_for_vreg(s,uVar35,vreg_01), iVar45 != -1)) {
                iVar18 = has_single_def_use(s,uVar35);
                iVar45 = extraout_EDX_03;
                if (iVar18 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar45 = extraout_EDX_04;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar45 = tmp_for_vreg(s,uVar35,iVar45);
              }
              else {
                iVar45 = load_oprnd(s,0,uVar12);
              }
            }
            pjVar32 = s->j->b_data;
            uVar35 = (uint)pjVar32[cVar4].data1;
            info_ptr = (code *)(ulong)uVar35;
            (*s->j->jmp_bi[cVar4])(s,uVar35,(int)pjVar32[cVar4].data2,iVar45,lVar23,iVar17);
            uVar35 = 0xffffffff;
            pvVar38 = extraout_RDX_11;
            uVar22 = local_f0;
            goto LAB_0010ed87;
          case '\r':
            iVar17 = get_new_label((pvVar40->opnds).a3.src2,local_e8);
            info_ptr = (code *)(long)iVar17;
            (*s->j->jv)(s,(unsigned_long)info_ptr);
            pvVar38 = extraout_RDX_05;
            break;
          case '\x0e':
            p_Var8 = s->j->special;
            if (p_Var8 != (special_op)0x0) {
              sVar6 = (pvVar40->opnds).spec.type;
              info_ptr = (code *)(ulong)sVar6;
              (*p_Var8)(s,sVar6,(pvVar40->opnds).spec.param);
              pvVar38 = extraout_RDX_03;
            }
            goto LAB_0010ed87;
          case '\x0f':
            uVar12 = (pvVar40->opnds).a3.dest;
            iVar17 = preg_of(s,pbVar20,uVar12);
            if (iVar17 == -1) {
              if ((uVar35 == uVar12) && (iVar17 = tmp_for_vreg(s,uVar35,vreg_04), iVar17 != -1)) {
                iVar45 = has_single_def_use(s,uVar35);
                iVar17 = extraout_EDX_09;
                if (iVar45 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar17 = extraout_EDX_10;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar17 = tmp_for_vreg(s,uVar35,iVar17);
              }
              else {
                iVar17 = load_oprnd(s,0,uVar12);
              }
            }
            info_ptr = (code *)(long)iVar17;
            (*s->j->jp)(s,(unsigned_long)info_ptr);
            pvVar38 = extraout_RDX_12;
            break;
          case '\x10':
            info_ptr = (code *)(pvVar40->opnds).bri.imm_a;
            (*s->j->jpi)(s,info_ptr);
            pvVar38 = extraout_RDX_02;
            break;
          case '\x11':
            bVar5 = pvVar40->insn_code;
            uVar12 = (pvVar40->opnds).a3.dest;
            if ((short)uVar12 < 0) {
              pushpop_inuse_regs(s,0,pvVar38);
              iVar17 = -1;
            }
            else {
              iVar17 = preg_of(s,pbVar20,uVar12);
              if (iVar17 == -1) {
                if ((uVar35 == uVar12) && (iVar17 = tmp_for_vreg(s,uVar35,-1), iVar17 != -1)) {
                  iVar45 = has_single_def_use(s,uVar35);
                  iVar17 = extraout_EDX_15;
                  if (iVar45 != 0) {
                    if (s->dill_debug != 0) {
                      puts(" -- Eliminating previous store -- ");
                      iVar17 = extraout_EDX_16;
                    }
                    s->p->cur_ip = s->p->code_base + iVar36;
                  }
                  iVar17 = tmp_for_vreg(s,uVar35,iVar17);
                }
                else {
                  iVar17 = load_oprnd(s,0,uVar12);
                }
              }
            }
            uVar35 = bVar5 & 0xf;
            info_ptr = (code *)(ulong)uVar35;
            (*s->j->push)(s,uVar35,iVar17);
            pvVar38 = extraout_RDX_20;
            break;
          case '\x12':
            if ((pvVar40->insn_code & 0xfU) == 8) {
              info_ptr = (code *)0x8;
              (*s->j->pushpi)(s,8,(pvVar40->opnds).bri.imm_a);
              pvVar38 = extraout_RDX_06;
            }
            else {
              info_ptr = (code *)0x4;
              (*s->j->pushi)(s,4,(pvVar40->opnds).spec.param);
              pvVar38 = extraout_RDX_09;
            }
            break;
          case '\x13':
            uVar35 = (byte)pvVar40->insn_code & 0xf;
            info_ptr = (code *)(ulong)uVar35;
            (*s->j->pushfi)(s,uVar35,(pvVar40->opnds).sf.imm);
            pvVar38 = extraout_RDX_08;
            break;
          case '\x14':
            pbVar24 = (basic_block_conflict)((long)&local_e0->bblist[1].start + local_40);
            iVar17 = (pvVar40->opnds).a3.dest;
            bVar5 = pvVar40->insn_code;
            uVar12 = bVar5 & 0xf;
            iVar45 = 0;
            if (uVar12 != 0xb) {
              iVar45 = preg_of(s,pbVar24,iVar17);
            }
            if ((bVar5 & 0x10) == 0) {
              iVar18 = (*s->j->calli)(s,uVar12,(pvVar40->opnds).bri.imm_a,
                                      (pvVar40->opnds).calli.xfer_name);
              pvVar38 = extraout_RDX_04;
            }
            else {
              lVar23 = (pvVar40->opnds).bri.imm_l;
              iVar16 = (int)lVar23;
              iVar18 = preg_of(s,pbVar20,iVar16);
              if (iVar18 == -1) {
                if ((lVar23 == (int)uVar35) &&
                   (iVar18 = tmp_for_vreg(s,iVar16,vreg_11), iVar18 != -1)) {
                  iVar15 = has_single_def_use(s,iVar16);
                  iVar18 = extraout_EDX_25;
                  if (iVar15 != 0) {
                    if (s->dill_debug != 0) {
                      puts(" -- Eliminating previous store -- ");
                      iVar18 = extraout_EDX_26;
                    }
                    s->p->cur_ip = s->p->code_base + iVar36;
                  }
                  iVar18 = tmp_for_vreg(s,iVar16,iVar18);
                }
                else {
                  iVar18 = load_oprnd(s,0,iVar16);
                }
              }
              iVar18 = (*s->j->callr)(s,uVar12,iVar18);
              pvVar38 = extraout_RDX_21;
            }
            if (uVar12 != 0xb) {
              iVar16 = preg_of(s,pbVar24,iVar17);
              if (iVar16 == -1) {
                iVar45 = offset_of(s,iVar17);
                iVar16 = dill_type_of(s,iVar17);
                if (iVar17 < 100) {
                  iVar17 = s->dill_param_reg_pointer;
                }
                else {
                  iVar17 = s->dill_local_pointer;
                }
                (*s->j->storei)(s,iVar16,0,iVar18,iVar17,(long)iVar45);
                pvVar38 = extraout_RDX_23;
              }
              else {
                (*s->j->mov)(s,uVar12,0,iVar45,iVar18);
                pvVar38 = extraout_RDX_22;
              }
            }
            info_ptr = (code *)0x1;
            pushpop_inuse_regs(s,1,pvVar38);
            pvVar38 = extraout_RDX_24;
            break;
          case '\x15':
            uVar12 = (pvVar40->opnds).a3.dest;
            uVar43 = (pvVar40->opnds).a3.src1;
            lVar23 = (pvVar40->opnds).spec.param;
            iVar17 = preg_of(s,pbVar20,uVar12);
            iVar45 = preg_of(s,pbVar20,uVar43);
            if (iVar45 == -1) {
              if ((uVar35 == uVar43) && (iVar45 = tmp_for_vreg(s,uVar35,vreg_08), iVar45 != -1)) {
                iVar18 = has_single_def_use(s,uVar35);
                iVar45 = extraout_EDX_19;
                if (iVar18 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar45 = extraout_EDX_20;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar45 = tmp_for_vreg(s,uVar35,iVar45);
              }
              else {
                iVar45 = load_oprnd(s,0,uVar43);
              }
            }
            if (iVar17 == -1) {
              pdVar29 = s->p;
              iVar17 = dill_type_of(s,uVar12);
              iVar17 = pdVar29->v_tmps[iVar17][0];
            }
            (*s->j->lea)(s,0,0,iVar17,iVar45,lVar23);
LAB_0010ea05:
            info_ptr = (code *)pbVar20;
            iVar17 = preg_of(s,pbVar20,uVar12);
            pvVar38 = extraout_RDX_15;
            uVar35 = 0xffffffff;
            if (iVar17 == -1) {
              iVar36 = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
              info_ptr = (code *)(ulong)uVar12;
              store_oprnd(s,uVar12,(int)extraout_RDX_15);
              pvVar38 = extraout_RDX_16;
              uVar35 = uVar12;
            }
            goto LAB_0010ed87;
          case '\x16':
            uVar12 = (pvVar40->opnds).a3.dest;
            uVar43 = (pvVar40->opnds).a3.src1;
            uVar42 = (pvVar40->opnds).a3.src2;
            bVar5 = pvVar40->insn_code;
            uVar14 = uVar43;
            local_f0 = uVar22;
            if ((uVar35 == uVar42) &&
               ((uVar13 = bVar5 - 4, 0x3d < uVar13 ||
                ((uVar42 = uVar35, (0x7f0fe1fc3f800U >> ((ulong)uVar13 & 0x3f) & 1) == 0 &&
                 (uVar42 = uVar43, uVar14 = uVar35,
                 (0x3f8000000000007fU >> ((ulong)uVar13 & 0x3f) & 1) == 0)))))) {
              puts("Unknown opcode in is_compare_commutative");
              uVar42 = uVar35;
              uVar14 = uVar43;
            }
            iVar17 = preg_of(s,pbVar20,uVar12);
            local_c8 = (char *)CONCAT44(local_c8._4_4_,iVar17);
            iVar45 = preg_of(s,pbVar20,uVar14);
            iVar17 = preg_of(s,pbVar20,uVar42);
            if (iVar45 == -1) {
              if ((uVar35 == uVar14) && (iVar45 = tmp_for_vreg(s,uVar35,vreg_12), iVar45 != -1)) {
                iVar18 = has_single_def_use(s,uVar35);
                iVar45 = extraout_EDX_27;
                if (iVar18 != 0) {
                  if (s->dill_debug != 0) {
                    puts(" -- Eliminating previous store -- ");
                    iVar45 = extraout_EDX_28;
                  }
                  s->p->cur_ip = s->p->code_base + iVar36;
                }
                iVar45 = tmp_for_vreg(s,uVar35,iVar45);
              }
              else {
                iVar45 = load_oprnd(s,0,uVar14);
              }
            }
            uVar22 = local_f0;
            if (iVar17 == -1) {
              iVar17 = load_oprnd(s,1,uVar42);
            }
            iVar18 = (int)local_c8;
            if ((int)local_c8 == -1) {
              pdVar29 = s->p;
              iVar18 = dill_type_of(s,uVar12);
              iVar18 = pdVar29->v_tmps[iVar18][0];
            }
            pjVar32 = s->j->c_data;
            (*s->j->jmp_c[(char)bVar5])
                      (s,(int)pjVar32[(char)bVar5].data1,(int)pjVar32[(char)bVar5].data2,iVar18,
                       iVar45,iVar17);
LAB_0010ec61:
            info_ptr = (code *)pbVar20;
            iVar17 = preg_of(s,pbVar20,uVar12);
            pvVar38 = extraout_RDX_18;
            uVar35 = 0xffffffff;
            if (iVar17 == -1) {
              iVar36 = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
              info_ptr = (code *)(ulong)uVar12;
              store_oprnd(s,uVar12,(int)extraout_RDX_18);
              pvVar38 = extraout_RDX_19;
              uVar35 = uVar12;
            }
            goto LAB_0010ed87;
          }
          uVar35 = 0xffffffff;
LAB_0010ed87:
        }
        foreach_bit(pbVar20->regs_defined,emit_putreg,pbVar20,s);
        uVar26 = local_48;
        if (count_verbose != 0) {
          uVar12 = (int)local_50 - (int)local_68;
          uVar35 = (*s->j->count_insn)(s,(int)local_58 - (int)local_60,
                                       *(int *)&s->p->cur_ip - *(int *)&s->p->code_base);
          printf("Basic Block %zd, %d virtual instructions, %d physical instructions\n",uVar26,
                 (ulong)uVar12,(ulong)uVar35);
        }
      }
      iVar36 = (int)uVar22;
      uVar35 = local_e8[iVar36].old_location;
      if ((long)pcVar19 * 0x28 - (ulong)uVar35 == 0) {
        dill_mark_label(s,local_e8[iVar36].new_label);
        uVar22 = (ulong)(iVar36 + 1U);
        uVar35 = plVar41[(int)(iVar36 + 1U)].old_location;
      }
      pmVar54 = local_e0;
      if (uVar35 != 0xffffffff) {
        printf("Some labels (%d, old loc %d) not placed\n",uVar22 & 0xffffffff);
      }
    }
    free_bbs(pmVar54);
    free(plVar41);
    if (local_b4 == 0) {
      handle = dill_finalize(s);
      dill_free_handle(handle);
    }
    else {
      (*s->j->package_end)(s);
    }
    pdVar29 = s->p;
    s->j = (pdVar29->native).mach_jump;
    (pdVar29->native).mach_reset = pdVar29->mach_reset;
    (pdVar29->native).mach_info = pdVar29->mach_info;
    (pdVar29->native).code_base = pdVar29->code_base;
    pcVar19 = pdVar29->code_limit;
    (pdVar29->native).cur_ip = pdVar29->cur_ip;
    (pdVar29->native).code_limit = pcVar19;
    if (local_b4 == 0) {
      pdVar29->code_base = (char *)0x0;
    }
    pdVar29->mach_info = (void *)0x0;
  }
  else {
    free_bbs(pmVar54);
    pdVar29 = s->p;
  }
  pdVar29->mach_reset = dill_virtual_init;
LAB_0010d2dc:
  if (virtual_do_end::dill_verbose != 0) {
    dill_dump(s);
  }
  return;
}

Assistant:

static void
virtual_do_end(dill_stream s, int package)
{
    static int no_optimize = -1;
    static int dill_verbose = -1;
    static int old_reg_alloc = -1;
    static int do_emulation = -1;

    virtual_mach_info vmi = (virtual_mach_info)s->p->mach_info;
    void* insns = s->p->code_base;
    void* code_end = s->p->cur_ip;
    void* prefix_begin =
        (char*)insns + (vmi->prefix_code_start * sizeof(virtual_insn));
    ;
    label_translation_table ltable;
    int virtual_local_pointer = s->dill_local_pointer;

    if (dill_verbose == -1) {
        dill_verbose = (getenv("DILL_VERBOSE") != NULL);
        no_optimize = (getenv("DILL_NOOPTIMIZE") != NULL);
        old_reg_alloc = (getenv("DILL_OLD_REGS") != NULL);
        do_emulation = (getenv("DILL_DO_EMULATION") != NULL);
#ifdef EMULATION_ONLY
        do_emulation = 1;
#endif
    }
    s->p->virtual.code_base = s->p->code_base;
    if (vmi->prefix_code_start == -1)
        prefix_begin = code_end;
    build_bbs(s, insns, prefix_begin, code_end);

    if (!no_optimize) {
        if (count_verbose == -1) {
            count_verbose = (getenv("DILL_COUNTS") != NULL);
        }
        if (count_verbose == 1) {
            printf("Prior to optimization, %d non-null virtual insns\n",
                   virtual_insn_count(s));
        }
        const_propagation(s, insns, vmi);
        if (count_verbose == 1) {
            printf("After constant propagation, %d non-null virtual insns\n",
                   virtual_insn_count(s));
        }
        CSE_elimination(s, insns, vmi);
        if (count_verbose == 1) {
            printf(
                "After duplicate instruction elimination (CSE-lite), %d "
                "non-null virtual insns\n",
                virtual_insn_count(s));
        }
        reset_use_def_count(s, insns, vmi);
        kill_dead_regs(s, insns, vmi);
    }

    if (dill_verbose) {
        dump_bbs(s);
        s->dill_debug = 1;
    }
    s->p->virtual.mach_jump = s->j;
    s->p->virtual.mach_reset = s->p->mach_reset;
    s->p->virtual.mach_info = s->p->mach_info;
    s->p->virtual.code_base = s->p->code_base;
    s->p->virtual.cur_ip = s->p->cur_ip;
    s->p->virtual.code_limit = s->p->code_limit;

    if (do_emulation) {
#ifdef BUILD_EMULATOR
        /* do a return, just in case it's missing */
        if (vmi->prefix_code_start == -1) {
            dill_retii(s, 0);
            s->p->virtual.cur_ip = s->p->cur_ip;
	    s->p->virtual.code_base = s->p->code_base;
	    s->p->virtual.code_limit = s->p->code_limit;
        }
        setup_VM_proc(s);
#endif
        free_bbs(vmi);
        s->p->mach_reset = dill_virtual_init;
    } else if (dill_foreign_cg) {
        (dill_foreign_cg)(s, (virtual_insn*)s->p->code_base,
                          (virtual_insn*)s->p->cur_ip);
    } else {
        s->j = s->p->native.mach_jump;
        s->p->mach_reset = s->p->native.mach_reset;
        s->p->mach_info = s->p->native.mach_info;
        s->p->code_base = s->p->native.code_base;
        s->p->native.code_base = NULL;
        s->p->native.mach_info = NULL;
        if (s->p->code_base == NULL) {
            init_code_block(s);
            s->p->native.code_base = s->p->code_base;
            s->p->native.code_limit = s->p->code_limit;
        }
        s->p->cur_ip = s->p->code_base;
        s->p->code_limit = s->p->native.code_limit;

        s->p->native_mach_reset(s);
        ltable = build_label_translation(s);
        (s->j->proc_start)(s, "no name", s->p->c_param_count, vmi->arg_info,
                           (void*)0);
        fill_label_translation(s, ltable);
        if (old_reg_alloc) {
            do_register_assign(s, insns, code_end, virtual_local_pointer, vmi);
            emit_insns(s, insns, ltable, vmi);
        } else {
            new_emit_insns(s, insns, ltable, vmi);
        }
        free_bbs(vmi);
        free(ltable);
        if (package) {
            s->j->package_end(s);
        } else {
            dill_exec_handle h;
            h = dill_finalize(s);
            dill_free_handle(h);
        }
        s->j = s->p->native.mach_jump;
        s->p->native.mach_reset = s->p->mach_reset;
        s->p->native.mach_info = s->p->mach_info;
        s->p->native.code_base = s->p->code_base;
        s->p->native.cur_ip = s->p->cur_ip;
        s->p->native.code_limit = s->p->code_limit;
        if (!package)
            s->p->code_base = NULL;
        s->p->mach_info = NULL;
        s->p->mach_reset = dill_virtual_init;
    }
    if (dill_verbose) {
        dill_dump(s);
    }
}